

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_tests.hpp
# Opt level: O0

void __thiscall LogChecker::~LogChecker(LogChecker *this)

{
  bool bVar1;
  char *message;
  char **in_R9;
  AssertionHelper local_200;
  Fixed local_1d0;
  char *local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  LogChecker *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::iuConsole::SetLogger((iuLogger *)0x0);
  iutest::detail::AlwaysZero();
  local_40 = std::__cxx11::string::c_str();
  local_48 = TestLogger::c_str(&this->printer_logger);
  iuutil::CmpHelperSTRIN<char_const*,char_const*>
            ((AssertionResult *)local_38,(iuutil *)"m_str.c_str()","printer_logger.c_str()",
             (char *)&local_40,&local_48,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/logger_tests.hpp"
               ,0x4c,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_200,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_200);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  TestLogger::clear(&this->printer_logger);
  TestLogger::~TestLogger(&this->printer_logger);
  LogCheckerBase::~LogCheckerBase(&this->super_LogCheckerBase);
  return;
}

Assistant:

~LogChecker(void)
    {
        ::iutest::detail::iuConsole::SetLogger(NULL);
        IUTEST_EXPECT_STRIN(m_str.c_str(), printer_logger.c_str());
        printer_logger.clear();
    }